

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_div(TCGContext_conflict11 *tcg_ctx,TCGv_i64 ret,TCGv_i64 source1,TCGv_i64 source2)

{
  TCGv_i64 ret_00;
  TCGv_i64 ret_01;
  TCGv_i64 c2;
  TCGv_i64 ret_02;
  uintptr_t o;
  uintptr_t o_1;
  uintptr_t o_3;
  
  ret_00 = tcg_temp_new_i64(tcg_ctx);
  ret_01 = tcg_temp_new_i64(tcg_ctx);
  c2 = tcg_const_i64_riscv64(tcg_ctx,0);
  ret_02 = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_movi_i64_riscv64(tcg_ctx,ret_02,-1);
  tcg_gen_setcondi_i64_riscv64(tcg_ctx,TCG_COND_EQ,ret_01,source2,-1);
  tcg_gen_setcondi_i64_riscv64(tcg_ctx,TCG_COND_EQ,ret_00,source1,-0x8000000000000000);
  tcg_gen_and_i64_riscv64(tcg_ctx,ret_00,ret_00,ret_01);
  tcg_gen_setcondi_i64_riscv64(tcg_ctx,TCG_COND_EQ,ret_01,source2,0);
  tcg_gen_movcond_i64_riscv64(tcg_ctx,TCG_COND_EQ,source1,ret_01,c2,source1,ret_02);
  tcg_gen_or_i64_riscv64(tcg_ctx,ret_00,ret_00,ret_01);
  tcg_gen_movi_i64_riscv64(tcg_ctx,ret_02,1);
  tcg_gen_movcond_i64_riscv64(tcg_ctx,TCG_COND_EQ,source2,ret_00,c2,source2,ret_02);
  tcg_gen_div_i64_riscv64(tcg_ctx,ret,source1,source2);
  tcg_temp_free_internal_riscv64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  tcg_temp_free_internal_riscv64(tcg_ctx,(TCGTemp *)(ret_01 + (long)tcg_ctx));
  tcg_temp_free_internal_riscv64(tcg_ctx,(TCGTemp *)(c2 + (long)tcg_ctx));
  tcg_temp_free_internal_riscv64(tcg_ctx,(TCGTemp *)(ret_02 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_div(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    gen_helper_div(tcg_ctx, cpu_gpr[rD(ctx->opcode)], tcg_ctx->cpu_env, cpu_gpr[rA(ctx->opcode)],
                   cpu_gpr[rB(ctx->opcode)]);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rD(ctx->opcode)]);
    }
}